

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Item * __thiscall
Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::rebal
          (Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData> *this,Item *item)

{
  Item *pIVar1;
  code *pcVar2;
  int iVar3;
  long local_78;
  Item **local_70;
  Item **local_68;
  long local_60;
  Item **local_58;
  Item **local_50;
  Item **cell_1;
  Item *parent_1;
  Item **cell;
  Item *parent;
  Item *item_local;
  Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData> *this_local;
  
  if (item->slope < 2) {
    this_local = (Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData> *)item;
    if (item->slope < -1) {
      if ((item->slope != -2) &&
         (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x1e5,"item->slope == -2"), iVar3 != 0)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      pIVar1 = item->parent;
      if (pIVar1 == (Item *)0x0) {
        local_70 = &this->root;
      }
      else {
        if (pIVar1->left == item) {
          local_68 = &pIVar1->left;
        }
        else {
          local_68 = &pIVar1->right;
        }
        local_70 = local_68;
      }
      if ((*local_70 != item) &&
         (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x1e8,"cell == item"), iVar3 != 0)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      shiftl(local_70);
      if ((*local_70)->slope < 0) {
        local_78 = -(*local_70)->slope;
      }
      else {
        local_78 = (*local_70)->slope;
      }
      if ((1 < local_78) &&
         (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x1ea,"(cell->slope < 0 ? -cell->slope : cell->slope) <= 1"),
         iVar3 != 0)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      this_local = (Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData> *)*local_70;
    }
  }
  else {
    if ((item->slope != 2) &&
       (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1db,"item->slope == 2"), iVar3 != 0)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pIVar1 = item->parent;
    if (pIVar1 == (Item *)0x0) {
      local_58 = &this->root;
    }
    else {
      if (pIVar1->left == item) {
        local_50 = &pIVar1->left;
      }
      else {
        local_50 = &pIVar1->right;
      }
      local_58 = local_50;
    }
    if ((*local_58 != item) &&
       (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1de,"cell == item"), iVar3 != 0)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    shiftr(local_58);
    if ((*local_58)->slope < 0) {
      local_60 = -(*local_58)->slope;
    }
    else {
      local_60 = (*local_58)->slope;
    }
    if ((1 < local_60) &&
       (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1e0,"(cell->slope < 0 ? -cell->slope : cell->slope) <= 1"),
       iVar3 != 0)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    this_local = (Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData> *)*local_58;
  }
  return (Item *)this_local;
}

Assistant:

Item* rebal(Item* item)
  {
    if(item->slope > 1)
    {
      ASSERT(item->slope == 2);
      Item* parent = item->parent;
      Item*& cell = parent ? (parent->left == item ? parent->left : parent->right) : root;
      ASSERT(cell == item);
      shiftr(cell);
      ASSERT((cell->slope < 0 ? -cell->slope : cell->slope) <= 1);
      return cell;
    }
    else if(item->slope < -1)
    {
      ASSERT(item->slope == -2);
      Item* parent = item->parent;
      Item*& cell = parent ? (parent->left == item ? parent->left : parent->right) : root;
      ASSERT(cell == item);
      shiftl(cell);
      ASSERT((cell->slope < 0 ? -cell->slope : cell->slope) <= 1);
      return cell;
    }
    return item;
  }